

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int flush_wbuff(archive_write *a)

{
  void *pvVar1;
  int iVar2;
  size_t s;
  int r;
  xar_conflict *xar;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  iVar2 = __archive_write_output
                    (a,(void *)((long)pvVar1 + 0x120),0x10000 - *(long *)((long)pvVar1 + 0x10120));
  if (iVar2 == 0) {
    *(undefined8 *)((long)pvVar1 + 0x10120) = 0x10000;
  }
  return iVar2;
}

Assistant:

static int
flush_wbuff(struct archive_write *a)
{
	struct xar *xar;
	int r;
	size_t s;

	xar = (struct xar *)a->format_data;
	s = sizeof(xar->wbuff) - xar->wbuff_remaining;
	r = __archive_write_output(a, xar->wbuff, s);
	if (r != ARCHIVE_OK)
		return (r);
	xar->wbuff_remaining = sizeof(xar->wbuff);
	return (r);
}